

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two_level_iterator.cc
# Opt level: O1

void __thiscall
leveldb::anon_unknown_6::TwoLevelIterator::SetDataIterator
          (TwoLevelIterator *this,Iterator *data_iter)

{
  char *pcVar1;
  long in_FS_OFFSET;
  Iterator *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->data_iter_).iter_ != (Iterator *)0x0) {
    IteratorWrapper::status((IteratorWrapper *)&local_30);
    if (local_30 != (Iterator *)0x0 && (this->status_).state_ == (char *)0x0) {
      pcVar1 = Status::CopyState((char *)local_30);
      (this->status_).state_ = pcVar1;
    }
    if (local_30 != (Iterator *)0x0) {
      operator_delete__(local_30);
    }
  }
  IteratorWrapper::Set(&this->data_iter_,data_iter);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TwoLevelIterator::SetDataIterator(Iterator* data_iter) {
  if (data_iter_.iter() != nullptr) SaveError(data_iter_.status());
  data_iter_.Set(data_iter);
}